

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O3

ComponentPtr
libcellml::flattenComponent(ComponentEntityPtr *parent,ComponentPtr *component,size_t index)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _func_int **pp_Var2;
  string *psVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  undefined1 auVar5 [8];
  element_type *peVar6;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  element_type *this;
  bool bVar8;
  _Atomic_word _Var9;
  int iVar10;
  size_t sVar11;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var12;
  long *plVar13;
  undefined8 uVar14;
  ImportedEntityImpl *pIVar15;
  _Rb_tree_node_base *p_Var16;
  iterator iVar17;
  size_t in_RCX;
  IndexStack *destinationStack;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  ModelPtr *model_00;
  void *__child_stack;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  size_t value;
  ulong uVar19;
  __weak_count<(__gnu_cxx::_Lock_policy)2> units1;
  libcellml *this_00;
  element_type *peVar20;
  Units *pUVar21;
  long lVar22;
  ulong uVar23;
  ImportedEntityImpl *pIVar24;
  _func_int **pp_Var25;
  undefined8 uVar26;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_R8;
  ComponentPtr *in_R9;
  UnitsPtr *units;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__x;
  long lVar27;
  ComponentPtr CVar28;
  ModelPtr MVar29;
  string newName;
  VariablePtr localModelVariable;
  StringStringMap unitNamesToReplace;
  ComponentPtr importedComponentCopy;
  ComponentNameMap newComponentNames;
  ModelPtr flatModel;
  ModelPtr clonedImportModel;
  vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
  uniqueRequiredUnits;
  UnitsPtr foundUnits;
  StringStringMap aliasedUnitsNames;
  ComponentPtr importedComponent;
  EquivalenceMap map;
  IndexStack importedComponentBaseIndexStack;
  ModelPtr importModel;
  ModelPtr requiredUnitsModel;
  IndexStack destinationComponentBaseIndexStack;
  NameList compNames;
  ImportSourcePtr importSource;
  ModelPtr model;
  vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
  requiredUnits;
  EquivalenceMap rebasedMap;
  undefined1 local_2d8 [40];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_2b0;
  undefined1 local_2a0 [32];
  undefined1 local_280 [8];
  undefined1 local_278 [8];
  string local_270;
  undefined1 local_250 [16];
  undefined1 local_240 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_230 [2];
  undefined1 local_210 [32];
  element_type *local_1f0;
  undefined1 local_1e8 [24];
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Stack_1d0;
  undefined8 local_1c8;
  string local_1c0;
  undefined1 local_1a0 [8];
  undefined1 local_198 [8];
  string local_190;
  ComponentEntity local_170;
  size_t local_160;
  ComponentPtr *local_158;
  undefined1 local_150 [8];
  undefined1 local_148 [24];
  _Base_ptr local_130;
  size_t local_128;
  IndexStack local_120;
  ImportSource local_108;
  Model local_e8;
  IndexStack local_c8;
  NameList local_b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_90;
  ParentedEntityConstPtr local_88;
  vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
  local_78;
  _Rb_tree<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::_Select1st<std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_std::less<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>
  local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var18;
  
  bVar8 = ImportedEntity::isImport((ImportedEntity *)(*(long *)index + 0x10));
  if (bVar8) {
    local_150 = *(undefined1 (*) [8])index;
    local_148._0_8_ = *(long *)(index + 8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._0_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._0_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._0_8_)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._0_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._0_8_)->_M_use_count + 1;
      }
    }
    local_158 = component;
    owningModel(&local_88);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._0_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._0_8_);
    }
    ImportedEntity::importSource((ImportedEntity *)(*(long *)index + 0x10));
    ImportSource::model(&local_108);
    pp_Var25 = local_108.super_Entity._vptr_Entity;
    ImportedEntity::importReference_abi_cxx11_
              ((string *)local_150,(ImportedEntity *)(*(long *)index + 0x10));
    iVar10 = 1;
    CVar28 = ComponentEntity::component(&local_170,(string *)pp_Var25,SUB81(local_150,0));
    _Var18 = CVar28.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ._M_pi;
    if (local_150 != (undefined1  [8])(local_148 + 8)) {
      operator_delete((void *)local_150,local_148._8_8_ + 1);
      _Var18._M_pi = extraout_RDX;
    }
    Model::clone((Model *)local_1e8,(__fn *)local_108.super_Entity._vptr_Entity,_Var18._M_pi,iVar10,
                 in_R8);
    componentNames_abi_cxx11_(&local_b0,(libcellml *)&local_88,model_00);
    indexStackOf(&local_c8,(ComponentPtr *)index);
    indexStackOf(&local_120,(ComponentPtr *)&local_170);
    local_148._16_8_ = local_148;
    local_148._0_8_ = local_148._0_8_ & 0xffffffff00000000;
    local_148._8_8_ = 0;
    local_128 = 0;
    local_130 = (_Base_ptr)local_148._16_8_;
    recordVariableEquivalences((ComponentPtr *)&local_170,(EquivalenceMap *)local_150,&local_120);
    generateEquivalenceMap((ComponentPtr *)&local_170,(EquivalenceMap *)local_150,&local_120);
    destinationStack = &local_c8;
    rebaseEquivalenceMap
              ((EquivalenceMap *)&local_60,(EquivalenceMap *)local_150,&local_120,destinationStack);
    Component::clone((Component *)local_250,
                     (__fn *)local_170.super_NamedEntity.super_ParentedEntity.super_Entity.
                             _vptr_Entity,__child_stack,(int)destinationStack,in_R8);
    uVar14 = local_250._0_8_;
    NamedEntity::name_abi_cxx11_((string *)local_1a0,*(NamedEntity **)index);
    NamedEntity::setName((NamedEntity *)uVar14,(string *)local_1a0);
    if (local_1a0 != (undefined1  [8])&local_190) {
      operator_delete((void *)local_1a0,(long)local_190._M_dataplus._M_p + 1);
    }
    for (uVar19 = 0; sVar11 = ComponentEntity::componentCount(*(ComponentEntity **)index),
        uVar14 = local_250._0_8_, uVar19 < sVar11; uVar19 = uVar19 + 1) {
      ComponentEntity::component((ComponentEntity *)local_1a0,*(size_t *)index);
      ComponentEntity::addComponent((ComponentEntity *)uVar14,(ComponentPtr *)local_1a0);
      if (local_198 != (undefined1  [8])0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198);
      }
    }
    local_1a0 = (undefined1  [8])local_250._0_8_;
    local_198 = (undefined1  [8])local_250._8_8_;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_250._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(local_250._8_8_ + 8) = *(_Atomic_word *)(local_250._8_8_ + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)(local_250._8_8_ + 8) = *(_Atomic_word *)(local_250._8_8_ + 8) + 1;
      }
    }
    unitsUsed(&local_78,(ModelPtr *)local_1e8,(ComponentConstPtr *)local_1a0);
    local_160 = in_RCX;
    if (local_198 != (undefined1  [8])0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198);
    }
    local_1c8 = 0;
    local_1e8._16_8_ = (element_type *)0x0;
    _Stack_1d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var16 = (_Rb_tree_node_base *)local_198;
    local_198 = (undefined1  [8])((ulong)local_198 & 0xffffffff00000000);
    local_190._M_dataplus._M_p = (pointer)0x0;
    local_190.field_2._8_8_ = 0;
    local_108.super_enable_shared_from_this<libcellml::ImportSource>._M_weak_this.
    super___weak_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         local_78.
         super__Vector_base<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    __x = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_78.
          super__Vector_base<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
    local_1f0 = (element_type *)index;
    local_190._M_string_length = (size_type)p_Var16;
    local_190.field_2._M_allocated_capacity = (size_type)p_Var16;
    local_108.super_enable_shared_from_this<libcellml::ImportSource>._M_weak_this.
    super___weak_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)parent;
    if (local_78.
        super__Vector_base<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_78.
        super__Vector_base<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        _Var7._M_pi = _Stack_1d0._M_pi;
        peVar20 = (element_type *)local_1e8._16_8_;
        paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)((__shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2> *)
                    &__x->_vptr__Sp_counted_base)->_M_ptr;
        pIVar15 = (ImportedEntityImpl *)
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&__x->_M_use_count)->_M_pi;
        if (pIVar15 == (ImportedEntityImpl *)0x0) {
          local_240._8_8_ = (ImportedEntityImpl *)0x0;
        }
        else {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var1 = &(pIVar15->mImportSource).
                      super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount;
            *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
            UNLOCK();
            if (__libc_single_threaded != '\0') goto LAB_002224ef;
            LOCK();
            p_Var1 = &(pIVar15->mImportSource).
                      super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount;
            *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
            UNLOCK();
            if (__libc_single_threaded != '\0') {
              _Var9 = *(_Atomic_word *)
                       &(pIVar15->mImportSource).
                        super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi;
              goto LAB_002224fb;
            }
            LOCK();
            p_Var1 = &(pIVar15->mImportSource).
                      super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount;
            *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
            UNLOCK();
            if (__libc_single_threaded != '\0') {
              _Var9 = *(_Atomic_word *)
                       &(pIVar15->mImportSource).
                        super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi;
              goto LAB_00222502;
            }
            LOCK();
            p_Var1 = &(pIVar15->mImportSource).
                      super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount;
            *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
            UNLOCK();
          }
          else {
            p_Var1 = &(pIVar15->mImportSource).
                      super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount;
            *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
LAB_002224ef:
            _Var9 = *(int *)&(pIVar15->mImportSource).
                             super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi + 1;
            *(_Atomic_word *)
             &(pIVar15->mImportSource).
              super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi = _Var9;
LAB_002224fb:
            _Var9 = _Var9 + 1;
            *(_Atomic_word *)
             &(pIVar15->mImportSource).
              super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi = _Var9;
LAB_00222502:
            *(_Atomic_word *)
             &(pIVar15->mImportSource).
              super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi = _Var9 + 1;
          }
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pIVar15);
          local_240._8_8_ = pIVar15;
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var1 = &(pIVar15->mImportSource).
                      super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount;
            *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
            UNLOCK();
          }
          else {
            p_Var1 = &(pIVar15->mImportSource).
                      super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount;
            *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
          }
        }
        lVar22 = (long)_Var7._M_pi - (long)peVar20;
        local_240._0_8_ = paVar4;
        if (0 < lVar22 >> 6) {
          lVar27 = (lVar22 >> 6) + 1;
          do {
            bVar8 = Units::equivalent((UnitsPtr *)peVar20,(UnitsPtr *)local_240);
            units1._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar20;
            if (bVar8) goto LAB_00222655;
            bVar8 = Units::equivalent((UnitsPtr *)
                                      &peVar20->super_enable_shared_from_this<libcellml::Model>,
                                      (UnitsPtr *)local_240);
            units1._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           &peVar20->super_enable_shared_from_this<libcellml::Model>;
            if (bVar8) goto LAB_00222655;
            bVar8 = Units::equivalent((UnitsPtr *)(peVar20 + 1),(UnitsPtr *)local_240);
            units1._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(peVar20 + 1);
            if (bVar8) goto LAB_00222655;
            bVar8 = Units::equivalent((UnitsPtr *)
                                      &peVar20[1].super_enable_shared_from_this<libcellml::Model>,
                                      (UnitsPtr *)local_240);
            units1._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           &peVar20[1].super_enable_shared_from_this<libcellml::Model>;
            if (bVar8) goto LAB_00222655;
            peVar20 = peVar20 + 2;
            lVar27 = lVar27 + -1;
            lVar22 = lVar22 + -0x40;
          } while (1 < lVar27);
        }
        lVar22 = lVar22 >> 4;
        if (lVar22 == 1) {
LAB_0022263f:
          bVar8 = Units::equivalent((UnitsPtr *)peVar20,(UnitsPtr *)local_240);
          units1._M_pi = _Var7._M_pi;
          if (bVar8) {
            units1._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar20;
          }
        }
        else {
          units1._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar20;
          if (lVar22 == 2) {
LAB_0022260d:
            bVar8 = Units::equivalent((UnitsPtr *)units1._M_pi,(UnitsPtr *)local_240);
            if (!bVar8) {
              peVar20 = (element_type *)
                        &((element_type *)units1._M_pi)->
                         super_enable_shared_from_this<libcellml::Model>;
              goto LAB_0022263f;
            }
          }
          else {
            units1._M_pi = _Var7._M_pi;
            if ((lVar22 == 3) &&
               (bVar8 = Units::equivalent((UnitsPtr *)peVar20,(UnitsPtr *)local_240),
               units1._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar20, !bVar8)) {
              units1._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             &peVar20->super_enable_shared_from_this<libcellml::Model>;
              goto LAB_0022260d;
            }
          }
        }
LAB_00222655:
        if ((ImportedEntityImpl *)local_240._8_8_ != (ImportedEntityImpl *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_240._8_8_);
        }
        if (pIVar15 != (ImportedEntityImpl *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pIVar15);
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pIVar15);
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pIVar15);
        }
        if (units1._M_pi == _Stack_1d0._M_pi) {
          std::
          vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
          ::push_back((vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
                       *)(local_1e8 + 0x10),(value_type *)__x);
        }
        else {
          NamedEntity::name_abi_cxx11_
                    ((string *)local_240,
                     &((__shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2> *)
                      &((element_type *)units1._M_pi)->super_ComponentEntity)->_M_ptr->
                      super_NamedEntity);
          NamedEntity::name_abi_cxx11_
                    ((string *)local_280,
                     &((__shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2> *)
                      &__x->_vptr__Sp_counted_base)->_M_ptr->super_NamedEntity);
          auVar5 = local_280;
          if ((undefined1  [8])local_240._8_8_ == local_278) {
            if ((ImportedEntityImpl *)local_240._8_8_ == (ImportedEntityImpl *)0x0) {
              bVar8 = false;
            }
            else {
              iVar10 = bcmp((void *)local_240._0_8_,(void *)local_280,local_240._8_8_);
              bVar8 = iVar10 != 0;
            }
          }
          else {
            bVar8 = true;
          }
          if (auVar5 != (undefined1  [8])&local_270) {
            operator_delete((void *)auVar5,(long)local_270._M_dataplus._M_p + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_240._0_8_ != local_230) {
            operator_delete((void *)local_240._0_8_,(ulong)(local_230[0]._M_allocated_capacity + 1))
            ;
          }
          if (bVar8) {
            NamedEntity::name_abi_cxx11_
                      ((string *)local_240,
                       &((__shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2> *)
                        &__x->_vptr__Sp_counted_base)->_M_ptr->super_NamedEntity);
            NamedEntity::name_abi_cxx11_
                      ((string *)local_280,
                       &((__shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2> *)
                        &((element_type *)units1._M_pi)->super_ComponentEntity)->_M_ptr->
                        super_NamedEntity);
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::_M_emplace_unique<std::__cxx11::string,std::__cxx11::string>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)local_1a0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_240,(string *)local_280);
            if (local_280 != (undefined1  [8])&local_270) {
              operator_delete((void *)local_280,(long)local_270._M_dataplus._M_p + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_240._0_8_ != local_230) {
              operator_delete((void *)local_240._0_8_,
                              (ulong)(local_230[0]._M_allocated_capacity + 1));
            }
          }
        }
        __x = __x + 1;
      } while (__x != local_108.super_enable_shared_from_this<libcellml::ImportSource>._M_weak_this.
                      super___weak_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi);
    }
    MVar29 = Model::create();
    _Var7._M_pi = _Stack_1d0._M_pi;
    _Var18 = MVar29.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e8._16_8_ != _Stack_1d0._M_pi) {
      peVar20 = (element_type *)local_1e8._16_8_;
      do {
        this = local_e8.super_enable_shared_from_this<libcellml::Model>._M_weak_this.
               super___weak_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        Units::clone((Units *)local_240,
                     (__fn *)((__shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2> *)
                             &peVar20->super_ComponentEntity)->_M_ptr,_Var18._M_pi,(int)p_Var16,
                     in_R8);
        Model::addUnits(this,(UnitsPtr *)local_240);
        _Var18._M_pi = extraout_RDX_00;
        if ((ImportedEntityImpl *)local_240._8_8_ != (ImportedEntityImpl *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_240._8_8_);
          _Var18._M_pi = extraout_RDX_01;
        }
        peVar20 = (element_type *)&peVar20->super_enable_shared_from_this<libcellml::Model>;
      } while (peVar20 != (element_type *)_Var7._M_pi);
    }
    createComponentNamesMap_abi_cxx11_
              ((ComponentNameMap *)local_240,(libcellml *)local_250,(ComponentPtr *)_Var18._M_pi);
    if ((_Rb_tree_node_base *)local_230[0]._8_8_ != (_Rb_tree_node_base *)(local_240 + 8)) {
      psVar3 = (string *)(local_210 + 0x10);
      uVar14 = local_230[0]._8_8_;
      do {
        local_280 = (undefined1  [8])&local_270;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_280,*(long *)(uVar14 + 0x20),
                   (long)&((_Rb_tree_node_base *)(uVar14 + 0x20))->_M_parent->_M_color +
                   *(long *)(uVar14 + 0x20));
        local_2d8._0_8_ = local_2d8 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_2d8,local_280,
                   (pointer)((long)local_280 + (long)(ImportSourcePtr *)local_278));
        this_00 = (libcellml *)0x1;
        while (_Var12 = std::
                        __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                                  (local_b0.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start,
                                   local_b0.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish,(string *)local_2d8),
              pUVar21 = (Units *)local_2d8._0_8_,
              _Var12._M_current !=
              local_b0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
          local_210._0_8_ = psVar3;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_210,local_280,
                     (pointer)((long)local_280 + (long)(ImportSourcePtr *)local_278));
          std::__cxx11::string::append((char *)local_210);
          convertToString_abi_cxx11_(&local_1c0,this_00,value);
          pp_Var25 = (_func_int **)0xf;
          if ((string *)local_210._0_8_ != psVar3) {
            pp_Var25 = (_func_int **)local_210._16_8_;
          }
          pp_Var2 = (_func_int **)
                    ((long)&((__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)
                            local_210._8_8_)->_M_ptr +
                    (long)(_func_int ***)local_1c0._M_string_length);
          in_R8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_210._8_8_;
          if (pp_Var25 < pp_Var2) {
            uVar26 = (_func_int **)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
              uVar26 = local_1c0.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar26 < pp_Var2) goto LAB_002229b2;
            plVar13 = (long *)std::__cxx11::string::replace
                                        ((ulong)&local_1c0,0,(char *)0x0,local_210._0_8_);
          }
          else {
LAB_002229b2:
            plVar13 = (long *)std::__cxx11::string::_M_append
                                        ((char *)local_210,(ulong)local_1c0._M_dataplus._M_p);
          }
          pUVar21 = (Units *)(plVar13 + 2);
          if ((Units *)*plVar13 == pUVar21) {
            local_2a0._16_8_ =
                 (pUVar21->super_NamedEntity).super_ParentedEntity.super_Entity._vptr_Entity;
            local_2a0._24_8_ = plVar13[3];
            local_2a0._0_8_ = (Units *)(local_2a0 + 0x10);
          }
          else {
            local_2a0._16_8_ =
                 (pUVar21->super_NamedEntity).super_ParentedEntity.super_Entity._vptr_Entity;
            local_2a0._0_8_ = (Units *)*plVar13;
          }
          local_2a0._8_8_ = plVar13[1];
          *plVar13 = (long)pUVar21;
          plVar13[1] = 0;
          *(undefined1 *)
           &(pUVar21->super_NamedEntity).super_ParentedEntity.super_Entity._vptr_Entity = 0;
          std::__cxx11::string::operator=((string *)local_2d8,(string *)local_2a0);
          if ((Units *)local_2a0._0_8_ != (Units *)(local_2a0 + 0x10)) {
            operator_delete((void *)local_2a0._0_8_,(ulong)(local_2a0._16_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
            operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
          }
          if ((string *)local_210._0_8_ != psVar3) {
            operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
          }
          this_00 = this_00 + 1;
        }
        if ((local_278 != (undefined1  [8])local_2d8._8_8_) ||
           ((local_278 != (undefined1  [8])0x0 &&
            (iVar10 = bcmp((void *)local_280,(void *)local_2d8._0_8_,(size_t)local_278), iVar10 != 0
            )))) {
          NamedEntity::setName(*(NamedEntity **)(uVar14 + 0x40),(string *)local_2d8);
          pUVar21 = (Units *)local_2d8._0_8_;
        }
        if (pUVar21 != (Units *)(local_2d8 + 0x10)) {
          operator_delete(pUVar21,local_2d8._16_8_ + 1);
        }
        if (local_280 != (undefined1  [8])&local_270) {
          operator_delete((void *)local_280,(long)local_270._M_dataplus._M_p + 1);
        }
        uVar14 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar14);
      } while ((_Rb_tree_node_base *)uVar14 != (_Rb_tree_node_base *)(local_240 + 8));
    }
    for (uVar19 = 0; peVar6 = local_1f0,
        sVar11 = Component::variableCount
                           ((Component *)
                            (local_1f0->super_ComponentEntity).super_NamedEntity.
                            super_ParentedEntity.super_Entity._vptr_Entity), uVar19 < sVar11;
        uVar19 = uVar19 + 1) {
      Component::variable((Component *)local_2d8,
                          (size_t)(peVar6->super_ComponentEntity).super_NamedEntity.
                                  super_ParentedEntity.super_Entity._vptr_Entity);
      for (uVar23 = 0; sVar11 = Variable::equivalentVariableCount((Variable *)local_2d8._0_8_),
          uVar23 < sVar11; uVar23 = uVar23 + 1) {
        Variable::equivalentVariable((Variable *)local_2a0,local_2d8._0_8_);
        uVar14 = local_250._0_8_;
        NamedEntity::name_abi_cxx11_((string *)local_280,(NamedEntity *)local_2d8._0_8_);
        Component::variable((Component *)local_210,(string *)uVar14);
        if (local_280 != (undefined1  [8])&local_270) {
          operator_delete((void *)local_280,(long)local_270._M_dataplus._M_p + 1);
        }
        Variable::addEquivalence((VariablePtr *)local_210,(VariablePtr *)local_2a0);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_210._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_210._8_8_);
        }
        if ((ImportedEntityImpl *)local_2a0._8_8_ != (ImportedEntityImpl *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a0._8_8_);
        }
      }
      if ((ImportedEntityImpl *)local_2d8._8_8_ != (ImportedEntityImpl *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_);
      }
    }
    ComponentEntity::replaceComponent
              (&((local_158->super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr)->super_ComponentEntity,local_160,(ComponentPtr *)local_250);
    local_280 = (undefined1  [8])local_250._0_8_;
    local_278 = (undefined1  [8])local_250._8_8_;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_250._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(local_250._8_8_ + 8) = *(_Atomic_word *)(local_250._8_8_ + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)(local_250._8_8_ + 8) = *(_Atomic_word *)(local_250._8_8_ + 8) + 1;
      }
    }
    owningModel((ParentedEntityConstPtr *)local_210);
    if (local_278 != (undefined1  [8])0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278);
    }
    applyEquivalenceMapToModel((EquivalenceMap *)&local_60,(ModelPtr *)local_210);
    local_278 = (undefined1  [8])((ulong)local_278 & 0xffffffff00000000);
    local_270._M_dataplus._M_p = (pointer)0x0;
    local_270.field_2._8_8_ = 0;
    local_1f0 = (element_type *)_Stack_1d0._M_pi;
    local_270._M_string_length = (size_type)local_278;
    local_270.field_2._M_allocated_capacity = (size_type)(_Rb_tree_node_base *)local_278;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e8._16_8_ != _Stack_1d0._M_pi) {
      peVar20 = (element_type *)local_1e8._16_8_;
      do {
        bVar8 = ImportedEntity::isImport
                          ((ImportedEntity *)
                           &((__shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2> *)
                            &peVar20->super_ComponentEntity)->_M_ptr->
                            super_enable_shared_from_this<libcellml::Model>);
        uVar14 = local_1e8._0_8_;
        if (bVar8) {
          NamedEntity::name_abi_cxx11_
                    ((string *)local_2d8,
                     (NamedEntity *)
                     ((__shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2> *)
                     &peVar20->super_ComponentEntity)->_M_ptr);
          Model::units((Model *)&local_1c0,(string *)uVar14);
          if ((Units *)local_2d8._0_8_ != (Units *)(local_2d8 + 0x10)) {
            operator_delete((void *)local_2d8._0_8_,local_2d8._16_8_ + 1);
          }
          units = (UnitsPtr *)0x0;
          pIVar24 = (ImportedEntityImpl *)0x0;
          do {
            NamedEntity::name_abi_cxx11_
                      ((string *)local_2d8,(NamedEntity *)local_1c0._M_dataplus._M_p);
            Model::units(&local_e8,local_1e8._0_8_);
            NamedEntity::name_abi_cxx11_
                      ((string *)local_2a0,
                       (NamedEntity *)
                       local_e8.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.
                       super_Entity._vptr_Entity);
            uVar14 = local_2a0._0_8_;
            if (local_2d8._8_8_ == local_2a0._8_8_) {
              if ((ImportedEntityImpl *)local_2d8._8_8_ == (ImportedEntityImpl *)0x0) {
                bVar8 = true;
              }
              else {
                iVar10 = bcmp((void *)local_2d8._0_8_,(void *)local_2a0._0_8_,local_2d8._8_8_);
                bVar8 = iVar10 == 0;
              }
            }
            else {
              bVar8 = false;
            }
            if ((Units *)uVar14 != (Units *)(local_2a0 + 0x10)) {
              operator_delete((void *)uVar14,(ulong)(local_2a0._16_8_ + 1));
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_e8.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.super_Entity.
                mPimpl != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_e8.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.
                         super_Entity.mPimpl);
            }
            if ((Units *)local_2d8._0_8_ != (Units *)(local_2d8 + 0x10)) {
              operator_delete((void *)local_2d8._0_8_,local_2d8._16_8_ + 1);
            }
            if (bVar8) {
              flattenUnitsImports((libcellml *)local_1e8,(ModelPtr *)peVar20,units,(size_t)local_250
                                  ,(ComponentPtr *)in_R8);
              Model::units((Model *)local_2d8,local_1e8._0_8_);
              pIVar15 = (ImportedEntityImpl *)local_2d8._8_8_;
              pUVar21 = (Units *)local_2d8._0_8_;
              local_2d8._0_8_ = (Units *)0x0;
              local_2d8._8_8_ = (ImportedEntityImpl *)0x0;
              if ((pIVar24 != (ImportedEntityImpl *)0x0) &&
                 (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pIVar24),
                 (ImportedEntityImpl *)local_2d8._8_8_ != (ImportedEntityImpl *)0x0)) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_);
              }
            }
            else {
              pUVar21 = (Units *)0x0;
              pIVar15 = pIVar24;
            }
            units = (UnitsPtr *)
                    ((long)&(units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>
                            )._M_ptr + 1);
            pIVar24 = pIVar15;
          } while (pUVar21 == (Units *)0x0);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._M_string_length);
          }
        }
        else {
          pIVar15 = (ImportedEntityImpl *)
                    (((__shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2> *)
                     &peVar20->super_ComponentEntity)->_M_refcount)._M_pi;
          pIVar24 = (ImportedEntityImpl *)0x0;
          pUVar21 = (Units *)((__shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2> *)
                             &peVar20->super_ComponentEntity)->_M_ptr;
        }
        local_2a0._0_8_ = pUVar21;
        if (pIVar15 != (ImportedEntityImpl *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var1 = &(pIVar15->mImportSource).
                      super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount;
            *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
            UNLOCK();
          }
          else {
            p_Var1 = &(pIVar15->mImportSource).
                      super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount;
            *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
          }
        }
        local_2a0._8_8_ = pIVar15;
        for (uVar19 = 0; sVar11 = Units::unitCount((Units *)local_2a0._0_8_), uVar19 < sVar11;
            uVar19 = uVar19 + 1) {
          Units::unitAttributeReference_abi_cxx11_
                    ((string *)local_2d8,(Units *)local_2a0._0_8_,uVar19);
          for (p_Var16 = (_Rb_tree_node_base *)local_270._M_string_length;
              p_Var16 != (_Rb_tree_node_base *)local_278;
              p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16)) {
            if (((ImportedEntityImpl *)local_2d8._8_8_ == (ImportedEntityImpl *)p_Var16[1]._M_parent
                ) && (((ImportedEntityImpl *)local_2d8._8_8_ == (ImportedEntityImpl *)0x0 ||
                      (iVar10 = bcmp((void *)local_2d8._0_8_,*(void **)(p_Var16 + 1),local_2d8._8_8_
                                    ), iVar10 == 0)))) {
              Units::setUnitAttributeReference
                        ((Units *)local_2a0._0_8_,uVar19,(string *)(p_Var16 + 2));
            }
          }
          if ((Units *)local_2d8._0_8_ != (Units *)(local_2d8 + 0x10)) {
            operator_delete((void *)local_2d8._0_8_,local_2d8._16_8_ + 1);
          }
        }
        in_R8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_250;
        transferUnitsRenamingIfRequired_abi_cxx11_
                  ((StringStringMap *)local_2d8,(libcellml *)local_1e8,(ModelPtr *)local_210,
                   (ModelPtr *)local_2a0,(UnitsPtr *)in_R8,in_R9);
        if (local_2b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_merge_unique<std::less<std::__cxx11::string>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)local_280,
                     (_Compatible_tree<std::less<std::__cxx11::basic_string<char>_>_> *)local_2d8);
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)local_2d8);
        if ((ImportedEntityImpl *)local_2a0._8_8_ != (ImportedEntityImpl *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a0._8_8_);
        }
        if (pIVar24 != (ImportedEntityImpl *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pIVar24);
        }
        peVar20 = (element_type *)&peVar20->super_enable_shared_from_this<libcellml::Model>;
      } while ((element_type *)peVar20 != local_1f0);
    }
    if ((_Rb_tree_node_base *)local_190._M_string_length != (_Rb_tree_node_base *)local_198) {
      p_Var16 = (_Rb_tree_node_base *)local_190._M_string_length;
      do {
        local_2d8._0_8_ = (Units *)(local_2d8 + 0x10);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_2d8,*(long *)(p_Var16 + 2),
                   (long)&(p_Var16[2]._M_parent)->_M_color + *(long *)(p_Var16 + 2));
        iVar17 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_280,(key_type *)local_2d8);
        if (iVar17._M_node != (_Rb_tree_node_base *)local_278) {
          std::__cxx11::string::_M_assign((string *)local_2d8);
        }
        Model::units((Model *)local_2a0,(string *)local_210._0_8_);
        updateUnitsNameUsages
                  ((string *)(p_Var16 + 1),(key_type *)local_2d8,(ComponentPtr *)local_250,
                   (UnitsPtr *)local_2a0);
        if ((ImportedEntityImpl *)local_2a0._8_8_ != (ImportedEntityImpl *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a0._8_8_);
        }
        if ((Units *)local_2d8._0_8_ != (Units *)(local_2d8 + 0x10)) {
          operator_delete((void *)local_2d8._0_8_,local_2d8._16_8_ + 1);
        }
        p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16);
      } while (p_Var16 != (_Rb_tree_node_base *)local_198);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_280);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_210._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_210._8_8_);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Component>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Component>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Component>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Component>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Component>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Component>_>_>_>
                 *)local_240);
    parent = (ComponentEntityPtr *)
             local_108.super_enable_shared_from_this<libcellml::ImportSource>._M_weak_this.
             super___weak_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (local_e8.super_enable_shared_from_this<libcellml::Model>._M_weak_this.
        super___weak_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_e8.super_enable_shared_from_this<libcellml::Model>._M_weak_this.
                 super___weak_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_1a0);
    std::
    vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>::
    ~vector((vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
             *)(local_1e8 + 0x10));
    std::
    vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>::
    ~vector(&local_78);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_250._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_250._8_8_);
    }
    std::
    _Rb_tree<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::_Select1st<std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_std::less<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>
    ::~_Rb_tree(&local_60);
    std::
    _Rb_tree<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::_Select1st<std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_std::less<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::_Select1st<std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_std::less<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>
                 *)local_150);
    if (local_120.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_120.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_120.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_120.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_c8.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_c8.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_b0);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e8._8_8_);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_170.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_170.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108.super_Entity.mPimpl !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108.super_Entity.mPimpl);
    }
    if (local_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90);
    }
    component = local_158;
    if (local_88.super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_88.
                 super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      component = local_158;
    }
  }
  CVar28 = ComponentEntity::component
                     ((ComponentEntity *)parent,
                      (size_t)(component->
                              super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
                              _M_ptr);
  CVar28.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)parent;
  return (ComponentPtr)CVar28.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ComponentPtr flattenComponent(const ComponentEntityPtr &parent, ComponentPtr &component, size_t index)
{
    if (component->isImport()) {
        auto model = owningModel(component);
        auto importSource = component->importSource();
        auto importModel = importSource->model();
        auto importedComponent = importModel->component(component->importReference());
        // Clone import model to not affect origin import model units.
        auto clonedImportModel = importModel->clone();

        NameList compNames = componentNames(model);

        // Determine the stack for the destination component.
        IndexStack destinationComponentBaseIndexStack = indexStackOf(component);

        // Determine the stack for the source component.
        IndexStack importedComponentBaseIndexStack = indexStackOf(importedComponent);

        // Generate equivalence map for the source component.
        EquivalenceMap map;
        recordVariableEquivalences(importedComponent, map, importedComponentBaseIndexStack);
        generateEquivalenceMap(importedComponent, map, importedComponentBaseIndexStack);

        // Rebase the generated equivalence map from the source component to the destination component.
        auto rebasedMap = rebaseEquivalenceMap(map, importedComponentBaseIndexStack, destinationComponentBaseIndexStack);

        // Take a copy of the imported component which will be used to replace the import defined in this model.
        auto importedComponentCopy = importedComponent->clone();
        importedComponentCopy->setName(component->name());
        for (size_t i = 0; i < component->componentCount(); ++i) {
            importedComponentCopy->addComponent(component->component(i));
        }

        // Get list of required units from component's variables and math cn elements.
        std::vector<UnitsPtr> requiredUnits = unitsUsed(clonedImportModel, importedComponentCopy);

        std::vector<UnitsPtr> uniqueRequiredUnits;
        StringStringMap aliasedUnitsNames;
        for (const auto &units : requiredUnits) {
            const auto iterator = std::find_if(uniqueRequiredUnits.begin(), uniqueRequiredUnits.end(),
                                               [=](const UnitsPtr &u) -> bool { return Units::equivalent(u, units); });
            if (iterator == uniqueRequiredUnits.end()) {
                uniqueRequiredUnits.push_back(units);
            } else if ((*iterator)->name() != units->name()) {
                aliasedUnitsNames.emplace(units->name(), (*iterator)->name());
            }
        }

        // Add all required units to a model so referenced units can be resolved.
        auto requiredUnitsModel = Model::create();
        for (const auto &units : uniqueRequiredUnits) {
            // Cloning units present elsewhere so that they don't get moved by the addUnits function.
            requiredUnitsModel->addUnits(units->clone());
        }

        // Make a map of component name to component pointer.
        ComponentNameMap newComponentNames = createComponentNamesMap(importedComponentCopy);
        for (const auto &entry : newComponentNames) {
            std::string originalName = entry.first;
            size_t count = 0;
            std::string newName = originalName;
            while (std::find(compNames.begin(), compNames.end(), newName) != compNames.end()) {
                newName = originalName + "_" + convertToString(++count);
            }
            if (originalName != newName) {
                entry.second->setName(newName);
            }
        }

        // If the component 'component' has variables then they are equivalent variables and they
        // need to be exchanged with the real variables from the component 'importedComponent'.
        for (size_t i = 0; i < component->variableCount(); ++i) {
            auto placeholderVariable = component->variable(i);
            for (size_t j = 0; j < placeholderVariable->equivalentVariableCount(); ++j) {
                auto localModelVariable = placeholderVariable->equivalentVariable(j);
                auto importedComponentVariable = importedComponentCopy->variable(placeholderVariable->name());
                Variable::addEquivalence(importedComponentVariable, localModelVariable);
            }
        }
        parent->replaceComponent(index, importedComponentCopy);
        auto flatModel = owningModel(importedComponentCopy);

        // Apply the re-based equivalence map onto the modified model.
        applyEquivalenceMapToModel(rebasedMap, flatModel);

        StringStringMap unitNamesToReplace;
        for (const auto &units : uniqueRequiredUnits) {
            // If the required units are imported units, we will resolve those units here.
            size_t unitsIndex = 0;
            UnitsPtr flattenedUnits = nullptr;
            if (units->isImport()) {
                auto foundUnits = clonedImportModel->units(units->name());
                while (flattenedUnits == nullptr) {
                    if (foundUnits->name() == clonedImportModel->units(unitsIndex)->name()) {
                        flattenUnitsImports(clonedImportModel, units, unitsIndex, importedComponentCopy);
                        flattenedUnits = clonedImportModel->units(unitsIndex);
                    }
                    unitsIndex += 1;
                }
            }

            auto replacementUnits = (flattenedUnits != nullptr) ? flattenedUnits : units;

            for (size_t unitIndex = 0; unitIndex < replacementUnits->unitCount(); ++unitIndex) {
                const std::string ref = replacementUnits->unitAttributeReference(unitIndex);
                for (const auto &entry : unitNamesToReplace) {
                    if (ref == entry.first) {
                        replacementUnits->setUnitAttributeReference(unitIndex, entry.second);
                    }
                }
            }
            StringStringMap changedNames = transferUnitsRenamingIfRequired(clonedImportModel, flatModel, replacementUnits, importedComponentCopy);
            if (!changedNames.empty()) {
                unitNamesToReplace.merge(changedNames);
            }
        }

        for (const auto &alias : aliasedUnitsNames) {
            std::string finalUnitsName = alias.second;
            const auto match = unitNamesToReplace.find(finalUnitsName);
            if (match != unitNamesToReplace.end()) {
                finalUnitsName = match->second;
            }
            UnitsPtr targetUnits = flatModel->units(finalUnitsName);
            updateUnitsNameUsages(alias.first, finalUnitsName, importedComponentCopy, targetUnits);
        }
    }

    return parent->component(index);
}